

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O0

void reduce_relational_op(List *list)

{
  List *ls_00;
  long lVar1;
  long lVar2;
  int iVar3;
  long n2;
  long n1;
  List *ls;
  BOOL val;
  BOOL equal;
  List *list_local;
  
  ls_00 = list->car;
  iVar3 = list_length(ls_00);
  if (iVar3 == 3) {
    if (((ls_00->cdr->token).type == (ls_00->cdr->cdr->token).type) &&
       ((((ls_00->cdr->token).type == TOK_NUMBER || ((ls_00->cdr->token).type == TOK_IDENTIFIER)) ||
        ((ls_00->cdr->token).type == TOK_QUOTED_STRING)))) {
      ls._0_4_ = tokens_equal(&ls_00->cdr->token,&ls_00->cdr->cdr->token);
      if ((ls_00->token).type != TOK_EQUAL) {
        if ((ls_00->token).type == TOK_NOT_EQUAL) {
          ls._0_4_ = (BOOL)(((BOOL)ls != FALSE ^ 0xffU) & 1);
        }
        else {
          if ((ls_00->cdr->token).type != TOK_NUMBER) {
            return;
          }
          if ((ls_00->cdr->cdr->token).type != TOK_NUMBER) {
            return;
          }
          lVar1 = (ls_00->cdr->token).u.n;
          lVar2 = (ls_00->cdr->cdr->token).u.n;
          switch((ls_00->token).type) {
          case TOK_GREATER_THAN:
            ls._0_4_ = (BOOL)(lVar2 < lVar1);
            break;
          case TOK_LESS_THAN:
            ls._0_4_ = (BOOL)(lVar1 < lVar2);
            break;
          case TOK_GREATER_OR_EQUAL:
            ls._0_4_ = (BOOL)(lVar2 <= lVar1);
            break;
          case TOK_LESS_OR_EQUAL:
            ls._0_4_ = (BOOL)(lVar1 <= lVar2);
            break;
          default:
            ls._0_4_ = FALSE;
            fatal_parse_error(ls_00,
                              "reduce.c internal error: non-relational op passed to reduce_relational_op().\n"
                             );
          }
        }
      }
      set_list_to_boolean(list,(uint)((BOOL)ls != FALSE));
    }
  }
  else {
    parse_error(ls_00,"Incorrect number of arguments to %s operator.\n",(ls_00->token).u.string);
  }
  return;
}

Assistant:

static void
reduce_relational_op (List *list)
{
  BOOL equal, val;
  List *ls = list->car;

  /* Make sure there are the right # of args. */
  if (list_length (ls) != 3)
    {
      parse_error (ls, "Incorrect number of arguments to %s operator.\n",
		   ls->token.u.string);
      return;
    }
  
  /* Make sure we are comparing two things of equal and appropriate types. */
  if (ls->cdr->token.type != (CDDR (ls))->token.type
      || (ls->cdr->token.type != TOK_NUMBER
	  && ls->cdr->token.type != TOK_IDENTIFIER
	  && ls->cdr->token.type != TOK_QUOTED_STRING))
    return;

  /* Are the two tokens equal? */
  equal = tokens_equal (&ls->cdr->token, &CDDR(ls)->token);

  /* See if we need to do a numeric or an arbitrary comparison. */
  if (ls->token.type == TOK_EQUAL)
    val = equal;
  else if (ls->token.type == TOK_NOT_EQUAL)
    val = !equal;
  else  /* It's a numerical comparison. */
    {
      long n1, n2;

      if (ls->cdr->token.type != TOK_NUMBER
	  || CDDR(ls)->token.type != TOK_NUMBER)
	{
	  return;
	}

      /* Fetch the two numbers to be compared. */
      n1 = ls->cdr->token.u.n;
      n2 = CDDR(ls)->token.u.n;

      switch (ls->token.type) {
      case TOK_GREATER_THAN:
	val = (n1 > n2);
	break;
      case TOK_LESS_THAN:
	val = (n1 < n2);
	break;
      case TOK_GREATER_OR_EQUAL:
	val = (n1 >= n2);
	break;
      case TOK_LESS_OR_EQUAL:
	val = (n1 <= n2);
	break;
      default:
	val = FALSE;
	fatal_parse_error (ls, "reduce.c internal error: non-relational op "
			   "passed to reduce_relational_op().\n");
	break;
      }
    }

  set_list_to_boolean (list, val ? TOK_TRUE : TOK_FALSE);
}